

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_xy(secp256k1_ge *r,secp256k1_fe *x,secp256k1_fe *y)

{
  secp256k1_fe *in_RDX;
  secp256k1_fe *in_RSI;
  void *in_RDI;
  
  secp256k1_fe_verify(in_RSI);
  secp256k1_fe_verify(in_RDX);
  *(undefined4 *)((long)in_RDI + 0x50) = 0;
  memcpy(in_RDI,in_RSI,0x28);
  memcpy((void *)((long)in_RDI + 0x28),in_RDX,0x28);
  secp256k1_ge_verify((secp256k1_ge *)0x11061a6);
  return;
}

Assistant:

static void secp256k1_ge_set_xy(secp256k1_ge *r, const secp256k1_fe *x, const secp256k1_fe *y) {
    SECP256K1_FE_VERIFY(x);
    SECP256K1_FE_VERIFY(y);

    r->infinity = 0;
    r->x = *x;
    r->y = *y;

    SECP256K1_GE_VERIFY(r);
}